

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Scene::downsample_selected_mesh(Scene *this)

{
  SceneObject *pSVar1;
  XFormWidget *pXVar2;
  Mesh *this_00;
  
  pSVar1 = (this->selected).object;
  if ((pSVar1 != (SceneObject *)0x0) && ((this->selected).element != (HalfedgeElement *)0x0)) {
    this_00 = (Mesh *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    if (this_00 != (Mesh *)0x0) {
      Mesh::downsample(this_00);
    }
    (this->hovered).coordinates.x = 0.0;
    (this->hovered).coordinates.y = 0.0;
    (this->hovered).object = (SceneObject *)0x0;
    (this->hovered).element = (HalfedgeElement *)0x0;
    (this->hovered).coordinates.z = 0.0;
    (this->hovered).axis = None;
    (this->selected).coordinates.z = 0.0;
    (this->selected).coordinates.x = 0.0;
    (this->selected).coordinates.y = 0.0;
    (this->selected).object = (SceneObject *)0x0;
    (this->selected).element = (HalfedgeElement *)0x0;
    (this->selected).axis = None;
    (this->edited).object = (SceneObject *)0x0;
    (this->edited).element = (HalfedgeElement *)0x0;
    (this->edited).coordinates.x = 0.0;
    (this->edited).coordinates.y = 0.0;
    (this->edited).coordinates.z = 0.0;
    (this->edited).axis = None;
    pXVar2 = this->elementTransform;
    (pXVar2->target).coordinates.z = 0.0;
    (pXVar2->target).coordinates.x = 0.0;
    (pXVar2->target).coordinates.y = 0.0;
    (pXVar2->target).object = (SceneObject *)0x0;
    (pXVar2->target).element = (HalfedgeElement *)0x0;
    (pXVar2->target).axis = None;
  }
  return;
}

Assistant:

void Scene::downsample_selected_mesh() {
   if( selected.object == nullptr || selected.element == nullptr ) return;
   Mesh* m = dynamic_cast<Mesh*>( selected.object );
   if( m ) m->downsample();
   clearSelections();
}